

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime_test.cpp
# Opt level: O0

void __thiscall ISPRIME_Negative_Test::TestBody(ISPRIME_Negative_Test *this)

{
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  allocator<bool> local_ad;
  bool local_ac [4];
  iterator local_a8;
  size_type local_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  allocator<bool> local_4d;
  bool local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<bool,_std::allocator<bool>_> res;
  ISPRIME_Negative_Test *this_local;
  
  res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)this;
  local_4c = isprime(-1);
  local_4b = isprime(-0x1475);
  local_4a = isprime(-0xefedb1);
  local_49 = isprime(-2);
  local_48 = &local_4c;
  local_40 = 4;
  std::allocator<bool>::allocator(&local_4d);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_38,__l_00,&local_4d);
  std::allocator<bool>::~allocator(&local_4d);
  local_ac[0] = false;
  local_ac[1] = false;
  local_ac[2] = false;
  local_ac[3] = false;
  local_a8 = local_ac;
  local_a0 = 4;
  std::allocator<bool>::allocator(&local_ad);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_98,__l,&local_ad);
  testing::internal::EqHelper<false>::
  Compare<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            ((EqHelper<false> *)local_70,"res","(vector<bool> {false, false, false, false})",
             (vector<bool,_std::allocator<bool>_> *)local_38,&local_98);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_98);
  std::allocator<bool>::~allocator(&local_ad);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/prime_test.cpp"
               ,7,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_38)
  ;
  return;
}

Assistant:

TEST(ISPRIME, Negative) {
	vector<bool> res = {isprime(-1), isprime(-5237), isprime(-15723953), isprime(-2)};
	EXPECT_EQ(res, (vector<bool> {false, false, false, false}));
}